

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O3

void Io_ReadPlaMarkContained(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  ulong uVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  size_t __size;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  
  iVar12 = nCubes >> 5;
  if (vMarks->nCap < nCubes) {
    iVar6 = (iVar12 + 1) - (uint)((nCubes & 0x1fU) == 0);
    __size = (long)iVar6 << 2;
    if (vMarks->pArray == (int *)0x0) {
      piVar3 = (int *)malloc(__size);
    }
    else {
      piVar3 = (int *)realloc(vMarks->pArray,__size);
    }
    vMarks->pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
    }
    vMarks->nCap = iVar6 * 0x20;
  }
  uVar2 = (uint)((nCubes & 0x1fU) != 0);
  iVar6 = iVar12 + uVar2;
  if (iVar6 != 0 && SCARRY4(iVar12,uVar2) == iVar6 < 0) {
    memset(vMarks->pArray,0,(ulong)(iVar6 - 1) * 4 + 4);
  }
  vMarks->nSize = iVar6 * 0x20;
  if (0 < nCubes) {
    uVar7 = (ulong)(uint)nCubes;
    uVar8 = 1;
    uVar4 = 0;
    do {
      if ((long)vMarks->nSize <= (long)uVar4) {
LAB_0033219d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      piVar3 = vMarks->pArray;
      uVar9 = uVar4 >> 5 & 0x7ffffff;
      uVar1 = uVar4 + 1;
      uVar5 = uVar8;
      if (uVar1 < uVar7 && ((uint)piVar3[uVar9] >> ((uint)uVar4 & 0x1f) & 1) == 0) {
        do {
          if ((long)vMarks->nSize <= (long)uVar5) goto LAB_0033219d;
          uVar11 = uVar5 >> 5 & 0x7ffffff;
          if (((uint)piVar3[uVar11] >> ((uint)uVar5 & 0x1f) & 1) == 0) {
            if (0 < nWords) {
              uVar10 = 0;
              do {
                if ((pCs[uVar4][uVar10] & ~pCs[uVar5][uVar10]) != 0) {
                  uVar11 = 0;
                  goto LAB_00332154;
                }
                uVar10 = uVar10 + 1;
              } while ((uint)nWords != uVar10);
            }
            piVar3[uVar11] = piVar3[uVar11] | 1 << ((byte)uVar5 & 0x1f);
          }
LAB_00332144:
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar7);
      }
LAB_0033217d:
      uVar8 = uVar8 + 1;
      uVar4 = uVar1;
    } while (uVar1 != uVar7);
  }
  return;
LAB_00332154:
  if ((pCs[uVar5][uVar11] & ~pCs[uVar4][uVar11]) != 0) goto LAB_00332144;
  uVar11 = uVar11 + 1;
  if ((uint)nWords == uVar11) {
    if ((long)vMarks->nSize <= (long)uVar4) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
    }
    piVar3[uVar9] = piVar3[uVar9] | 1 << ((byte)uVar4 & 0x1f);
    goto LAB_0033217d;
  }
  goto LAB_00332154;
}

Assistant:

void Io_ReadPlaMarkContained( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c2;
    Vec_BitFill( vMarks, nCubes, 0 );
    for ( c1 = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
            for ( c2 = c1 + 1; c2 < nCubes; c2++ )
                if ( !Vec_BitEntry(vMarks, c2) )
                {
                    if ( Abc_TtImply(pCs[c1], pCs[c2], nWords) )
                        Vec_BitWriteEntry( vMarks, c2, 1 );
                    else if ( Abc_TtImply(pCs[c2], pCs[c1], nWords) )
                    {
                        Vec_BitWriteEntry( vMarks, c1, 1 );
                        break;
                    }
                }
}